

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O2

double __thiscall BGIP_SolverCE::Solve(BGIP_SolverCE *this)

{
  int *piVar1;
  pointer *ppdVar2;
  undefined1 *puVar3;
  _List_node_base *p_Var4;
  _List_node_base **pp_Var5;
  long lVar6;
  long *plVar7;
  BayesianGameBase *this_00;
  value_type pPVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  undefined1 auVar11 [16];
  int iVar12;
  value_type vVar13;
  undefined4 uVar14;
  size_type __n;
  size_type __n_00;
  reference this_01;
  JointPolicyPureVector *this_02;
  reference ppPVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  const_reference pvVar16;
  reference pvVar17;
  JPPVValuePair *this_04;
  ostream *poVar18;
  undefined8 *puVar19;
  allocator_type *in_RCX;
  __time_t extraout_RDX;
  uint uVar20;
  BGIP_SolverCE *this_05;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  element_type *this_06;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 in_XMM2 [16];
  timeval tVar28;
  allocator_type local_1b9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ta_vec;
  value_type_conflict2 local_184;
  BGIP_SolverCE *local_180;
  double local_178;
  size_type local_170;
  uint local_168;
  int local_164;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> best_samples;
  double local_148;
  shared_ptr<JointPolicyPureVector> p_jpol;
  double local_120;
  I_PtPDpure_constPtr local_118;
  ulong local_108;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Xi;
  timeval start_time;
  I_PtPDpure_constPtr local_d8;
  JointPolicyPureVector jpol_best;
  undefined1 extraout_var [56];
  
  (*(code *)**(undefined8 **)&this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
  )();
  local_d8.px = *(element_type **)
                 &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8
  ;
  local_d8.pn.pi_ =
       *(sp_counted_base **)
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
  lVar6 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                    field_0x10;
  if (lVar6 != 0) {
    LOCK();
    piVar1 = (int *)(lVar6 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  ta_vec.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  JointPolicyPureVector::JointPolicyPureVector(&jpol_best,&local_d8,TYPE_INDEX);
  boost::detail::shared_count::~shared_count(&local_d8.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ta_vec.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  iVar12 = gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
  if (iVar12 != 0) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar19 = "Error with gettimeofday";
    __cxa_throw(puVar19,&char_const*::typeinfo,0);
  }
  ta_vec.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
  ta_vec.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
  if (ta_vec.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    LOCK();
    ppdVar2 = &((ta_vec.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    *(int *)ppdVar2 = *(int *)ppdVar2 + 1;
    UNLOCK();
  }
  local_170 = (*(code *)((ta_vec.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[3])();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ta_vec.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  lVar6 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                    field_0x10;
  ta_vec.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ =
       *(undefined1 (*) [16])
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
  if (lVar6 != 0) {
    LOCK();
    piVar1 = (int *)(lVar6 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_108 = BayesianGameBase::GetNrJointTypes();
  local_180 = this;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ta_vec.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&Xi,local_170,(allocator_type *)&ta_vec);
  for (uVar20 = 0; uVar20 < local_170; uVar20 = uVar20 + 1) {
    ta_vec.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
    ta_vec.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
    if (ta_vec.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      LOCK();
      ppdVar2 = &((ta_vec.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *(int *)ppdVar2 = *(int *)ppdVar2 + 1;
      UNLOCK();
    }
    __n = (*(code *)((ta_vec.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[5])
                    (ta_vec.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,uVar20,0,999999);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &ta_vec.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    puVar3 = &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
              field_0x8;
    plVar7 = *(long **)puVar3;
    lVar6 = *(long *)&(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                      field_0x10;
    ta_vec.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ = *(undefined1 (*) [16])puVar3;
    if (lVar6 != 0) {
      LOCK();
      piVar1 = (int *)(lVar6 + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    __n_00 = (**(code **)(*plVar7 + 0x20))(plVar7,uVar20);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &ta_vec.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    auVar11 = vcvtusi2sd_avx512f(in_XMM2,__n_00);
    p_jpol.px = (element_type *)(1.0 / auVar11._0_8_);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&best_samples,__n_00,
               (value_type_conflict *)&p_jpol,(allocator_type *)&local_184);
    in_RCX = &local_1b9;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&ta_vec,__n,(value_type *)&best_samples,in_RCX);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&best_samples);
    this_01 = std::
              vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              ::at(&Xi,(ulong)uVar20);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(this_01,&ta_vec);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&ta_vec);
  }
  local_148 = -1.79769313486232e+308;
  this_05 = local_180;
  for (uVar21 = 0; uVar21 < this_05->_m_nrRestarts; uVar21 = (ulong)((int)uVar21 + 1)) {
    local_168 = (uint)uVar21;
    for (uVar20 = 0; (ulong)uVar20 < this_05->_m_nrIterations; uVar20 = uVar20 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ta_vec,"CE deadline exceeded",(allocator<char> *)&best_samples);
      (**(code **)(*(long *)&this_05->
                             super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> + 8))
                (this_05,(string *)&ta_vec);
      std::__cxx11::string::~string((string *)&ta_vec);
      best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
      _M_node._M_size = 0;
      uVar22 = 0;
      local_120 = -1.79769313486232e+308;
      best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)&best_samples;
      best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)&best_samples;
      while( true ) {
        if (this_05->_m_nrSampledJointPolicies <= uVar22) break;
        this_02 = (JointPolicyPureVector *)operator_new(0x98);
        local_118.px = *(element_type **)
                        &(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>)
                         .field_0x8;
        local_118.pn.pi_ =
             *(sp_counted_base **)
              &(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
               field_0x10;
        lVar6 = *(long *)&(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                          ).field_0x10;
        if (lVar6 == 0) {
          local_118.pn.pi_ = (sp_counted_base *)0x0;
        }
        else {
          LOCK();
          piVar1 = (int *)(lVar6 + 8);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        ta_vec.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ta_vec.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        JointPolicyPureVector::JointPolicyPureVector(this_02,&local_118);
        boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>(&p_jpol,this_02)
        ;
        local_164 = (int)uVar22;
        boost::detail::shared_count::~shared_count(&local_118.pn);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &ta_vec.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        this_06 = p_jpol.px + 0x68;
        for (uVar23 = 0; uVar21 = (ulong)uVar23, uVar21 < local_170; uVar23 = uVar23 + 1) {
          ppPVar15 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::at
                               ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                                this_06,uVar21);
          SampleIndividualPolicy
                    (*ppPVar15,
                     Xi.
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar21);
        }
        puVar3 = &(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                  field_0x8;
        this_00 = *(BayesianGameBase **)puVar3;
        lVar6 = *(long *)&(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                          ).field_0x10;
        ta_vec.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = *(undefined1 (*) [16])puVar3;
        if (lVar6 != 0) {
          LOCK();
          piVar1 = (int *)(lVar6 + 8);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &ta_vec.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        local_178 = 0.0;
        for (uVar21 = 0; iVar12 = local_164, uVar23 = local_168, this_05 = local_180,
            uVar21 < local_108; uVar21 = (ulong)((Index)uVar21 + 1)) {
          if ((int)(uVar21 % 10000) == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ta_vec,"CE deadline exceeded",(allocator<char> *)&local_184);
            (**(code **)(*(long *)&local_180->
                                   super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                        + 8))(local_180,(string *)&ta_vec);
            std::__cxx11::string::~string((string *)&ta_vec);
          }
          dVar24 = (double)(**(code **)(*(long *)this_00 + 0x68))(this_00,uVar21);
          if (0.0 < dVar24) {
            this_03 = BayesianGameBase::JointToIndividualTypeIndices(this_00,(Index)uVar21);
            local_184 = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ta_vec,local_170,
                       &local_184,(allocator_type *)&local_1b9);
            for (uVar23 = 0; uVar22 = (ulong)uVar23, uVar22 < local_170; uVar23 = uVar23 + 1) {
              ppPVar15 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::at
                                   ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>
                                     *)this_06,uVar22);
              pPVar8 = *ppPVar15;
              pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_03,uVar22)
              ;
              vVar13 = (**(code **)(*(long *)pPVar8 + 0x40))(pPVar8,*pvVar16);
              pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ta_vec,
                                   uVar22);
              *pvVar17 = vVar13;
            }
            uVar14 = (**(code **)(*(long *)this_00 + 0x38))(this_00,(string *)&ta_vec);
            auVar26._0_8_ = (**(code **)(*(long *)this_00 + 0x80))(this_00,uVar21,uVar14);
            auVar26._8_56_ = extraout_var;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = local_178;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = dVar24;
            auVar11 = vfmadd231sd_fma(auVar27,auVar26._0_16_,auVar11);
            local_178 = auVar11._0_8_;
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ta_vec);
          }
        }
        in_RCX = (allocator_type *)local_180->_m_nrJointPoliciesForUpdate;
        if (((best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
              _M_impl._M_node._M_size < in_RCX) || (local_120 < local_178)) &&
           ((local_180->_m_use_gamma != true || (-1.79769313486232e+308 < local_178)))) {
          if ((allocator_type *)
              best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
              _M_impl._M_node._M_size == in_RCX) {
            if (best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                _M_impl._M_node.super__List_node_base._M_prev[1]._M_next != (_List_node_base *)0x0)
            {
              (*(code *)(best_samples.
                         super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl
                         ._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next->_M_prev)();
            }
            std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::pop_back
                      (&best_samples);
          }
          this_04 = (JPPVValuePair *)operator_new(0x20);
          JPPVValuePair::JPPVValuePair(this_04,(shared_ptr *)&p_jpol,local_178);
          OrderedInsertJPPVValuePair(this_04,&best_samples);
          local_120 = (double)(*(code *)(best_samples.
                                         super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                                         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)
                                        ->_M_next[1]._M_prev)();
        }
        uVar21 = (ulong)uVar23;
        boost::detail::shared_count::~shared_count(&p_jpol.pn);
        uVar22 = (ulong)(iVar12 + 1);
      }
      if (this_05->_m_use_gamma != false) {
        (*(code *)(best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                   _M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next[1]._M_prev)();
      }
      dVar24 = (double)(*(code *)(best_samples.
                                  super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                                  ._M_impl._M_node.super__List_node_base._M_next[1]._M_next)->
                                 _M_next[1]._M_prev)();
      if (local_148 < dVar24) {
        if ((this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xc8
            == '\x01') {
          tVar28.tv_usec = (__suseconds_t)in_RCX;
          tVar28.tv_sec = extraout_RDX;
          dVar25 = (double)TimeTools::GetDeltaTimeDouble((timeval)start_time,tVar28);
          poVar18 = std::ostream::_M_insert<double>(dVar24);
          std::operator<<(poVar18,"\t");
          poVar18 = std::ostream::_M_insert<double>(dVar25);
          std::operator<<(poVar18,"\t");
        }
        p_Var4 = best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next[1]._M_next + 1;
        p_Var9 = p_Var4->_M_next;
        p_Var10 = best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_prev;
        ta_vec.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = *p_Var4;
        if (p_Var10 != (_List_node_base *)0x0) {
          LOCK();
          pp_Var5 = &p_Var10->_M_prev;
          *(int *)pp_Var5 = *(int *)pp_Var5 + 1;
          UNLOCK();
        }
        JointPolicyPureVector::operator=(&jpol_best,(JointPolicyPureVector *)p_Var9);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &ta_vec.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        local_148 = dVar24;
      }
      UpdateCEProbDistribution(this_05,&Xi,&best_samples);
      while (best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
             _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&best_samples) {
        if (best_samples.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl
            ._M_node.super__List_node_base._M_next[1]._M_next != (_List_node_base *)0x0) {
          (*(code *)(best_samples.
                     super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
                     _M_node.super__List_node_base._M_next[1]._M_next)->_M_next->_M_prev)();
        }
        std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::pop_front
                  (&best_samples);
      }
      std::__cxx11::_List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::_M_clear
                ((_List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)&best_samples);
    }
  }
  if ((this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xc8 != '\0'
     ) {
    std::endl<char,std::char_traits<char>>
              (*(ostream **)
                &(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                 field_0xd0);
    std::endl<char,std::char_traits<char>>
              (*(ostream **)
                &(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                 field_0xd8);
  }
  BGIPSolution::AddSolution
            ((JointPolicyPureVector *)
             &(this_05->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x18
             ,local_148);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector(&Xi);
  JointPolicyPureVector::~JointPolicyPureVector(&jpol_best);
  return local_148;
}

Assistant:

double Solve()
        {
            InitDeadline();

            double v_best = -DBL_MAX;
            //Index jpolI_best = 0;
            JointPolicyPureVector jpol_best(this->GetBGIPI(), TYPE_INDEX); //temporary?
            
            struct timeval start_time, cur_time;
            if(gettimeofday(&start_time, NULL) != 0)
                throw "Error with gettimeofday";
            
        //the algorithm has the following form
        //create initial joint policy distribution
        //for number of restarts
            //while improving
                //sample joint policies
                //evaluate and rank the sampled policies
                //update the probability distribution

            //get some vars:
            size_t nrAgents = this->GetBGIPI()->GetNrAgents();
            size_t nrJT = this->GetBGIPI()->GetNrJointTypes();

            //create initial joint policy distribution
            //Xi is the parameter 'std::vector' for the joint probability distribution 
            //with the following form:
            //Xi[agentI][typeI][actionI] (= Pr(actionI | typeI, agentI) )
            std::vector< std::vector< std::vector<double> > > Xi (nrAgents);
            for(Index agentI=0; agentI < nrAgents; agentI++)
            {
                size_t nrTypes = 
                    this->GetBGIPI()->GetNrPolicyDomainElements(agentI, 
                                                             TYPE_INDEX);
                size_t nrAcs = this->GetBGIPI()->GetNrActions(agentI);
                std::vector< std::vector<double> > ta_vec =
                    std::vector< std::vector<double> >(nrTypes, 
                                             std::vector<double>(nrAcs, 1.0 / nrAcs) ); //uniform dist. at start
                Xi.at(agentI)=ta_vec;
            }

            //for number of restarts
            for(Index restart=0; restart < _m_nrRestarts; restart++)
            {
                //for now, we use a fixed number of iterations:
                for(Index iter=0; iter < _m_nrIterations; iter++)
                {
                    CheckDeadline("CE deadline exceeded");

                    std::list<JPPVValuePair*> best_samples;
                    double v_xth_best = -DBL_MAX;
                    double v_gamma = -DBL_MAX;
                    for(Index sample=0; sample < _m_nrSampledJointPolicies; sample++)
                    {
                        boost::shared_ptr<JointPolicyPureVector> p_jpol =
                            boost::shared_ptr<JointPolicyPureVector>(new JointPolicyPureVector( this->GetBGIPI() ));
                        //sample next joint policy
                        std::vector< PolicyPureVector* > & BGpolicies = p_jpol->
                            GetIndividualPolicies();
                        for(Index agentI=0; agentI < nrAgents; agentI++)
                            //sample individual policy for next agent
                            SampleIndividualPolicy(*(BGpolicies.at(agentI)),Xi[agentI]);
#if DEBUG_BGIP_SOLVER_CE
                        {
                            std::cout << "sampled new policy: "<<
                                p_jpol->GetIndex();
                        }
#endif                
                        //evaluate 
                        double v = 0.0;        

                        const BayesianGameIdenticalPayoffInterface* bgipRawPtr=this->GetBGIPI().get();
                        for(Index jt = 0; jt < nrJT; jt++)
                        {
                            if(jt % 10000 == 0)
                                CheckDeadline("CE deadline exceeded");

                            double P_jt = bgipRawPtr->GetProbability(jt);
                            if(P_jt>0)
                            {
                                const std::vector<Index>& indTypes = bgipRawPtr->
                                    JointToIndividualTypeIndices(jt);
                                std::vector<Index> indAcs(nrAgents, 0);
                                //determine action of agentI 
                                for(Index agentI=0; agentI < nrAgents; agentI++)
                                    indAcs.at(agentI) = BGpolicies.at(agentI)->
                                        GetActionIndex(indTypes.at(agentI));
                                
                                Index ja = bgipRawPtr->IndividualToJointActionIndices(indAcs);
                                v += P_jt * bgipRawPtr->GetUtility(jt, ja);
                            }
                        }
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << ", value="<<v<<std::endl;
#endif                
                        //retain it if it ranks among the best...
                        //we maintain an ordered std::list with contains the x best
                        //policies (pol-val pairs). (x = _m_nrJointPoliciesForUpdate)
                        //front() is the highest ranked policy and
                        //back() the lowest ranked one.
                        if(
                            //either we have not sampled x policies
                            (   best_samples.size() <  _m_nrJointPoliciesForUpdate
                                || 
                                //or the value of this policy is better 
                                (v > v_xth_best)
                                )
                            &&  ( (!_m_use_gamma) || (v > v_gamma)  )
                            )
                        {
                            if (best_samples.size() ==  _m_nrJointPoliciesForUpdate)
                            {
#if DEBUG_BGIP_SOLVER_CE
                                std::cout << "best_samples full: making space...";
#endif
                                delete best_samples.back();
                                best_samples.pop_back(); //make room
                            }
                            JPPVValuePair* polval = new JPPVValuePair(p_jpol,v);
                            OrderedInsertJPPVValuePair(polval, best_samples);
                            JPPVValuePair* back = best_samples.back();
                            v_xth_best = back->GetValue();
#if DEBUG_BGIP_SOLVER_CE
                            std::cout << "inserted pol (v="<<v<<") - v_xth_best now:"
                                 << v_xth_best << std::endl;
                            std::cout <<"best_samples contains the following pol/val pairs:"
                                 << std::endl;
                            PrintBestSamples(best_samples);
                            std::cout << std::endl;
#endif
                        }
                        else
                        {
//                            delete p_jpol;
                        }
                    } //end for samples
                    if(_m_use_gamma) //update the gamma
                    {
                        JPPVValuePair* back = best_samples.back();
                        v_gamma = back->GetValue();
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << "new v_gamma="<<v_gamma<<std::endl;
#endif
                    }
                    //retain the very best sample:
                    double v_best_this_iter = best_samples.front()->GetValue();
                    if(v_best_this_iter > v_best)
                    {
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << "new absolute best="<<v_best_this_iter <<
                            " (old="<< v_best <<")"<<std::endl;
#endif
                        v_best = v_best_this_iter;
                        if(this->GetWriteAnyTimeResults()){
                            double delta  = TimeTools::GetDeltaTimeDouble(start_time, cur_time);

                            (*this->GetResultsOFStream()) << v_best << "\t";
                            (*this->GetTimingsOFStream()) << delta << "\t";
                            
                        }
                        //LIndex too short...
                        //jpolI_best = best_samples.front()->GetJPPV()->GetIndex();
                        jpol_best =  *(best_samples.front()->GetJPPV());
                    }
                
                    //update the probability distribution
                    UpdateCEProbDistribution(Xi, best_samples);
#if DEBUG_BGIP_SOLVER_CE
                    for(Index agentI=0; agentI < nrAgents; agentI++)
                    {
                        std::cout << "updated parameter std::vector for agent "<<agentI<<":";
                        PrintVectorCout(Xi[agentI]);
                        std::cout << std::endl;
                    }
#endif
                    //delete std::list
                    while(!best_samples.empty())
                    {
                        delete best_samples.front();
                        best_samples.pop_front();
                    }
                } //end iteration
            } // end restart
            //end the line in the results file
            if(this->GetWriteAnyTimeResults()){
                (*this->GetResultsOFStream()) << std::endl;
                (*this->GetTimingsOFStream()) << std::endl;
            } 

            //JointPolicyPureVector best_found(*this->GetBGIPI());
            //best_found.SetIndex(jpolI_best);
            //_m_solution.SetPolicy(best_found);

            this->AddSolution(jpol_best,v_best);
            
            return(v_best);
        }